

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O2

Result __thiscall spectest::JSONParser::ParseCommand(JSONParser *this,CommandPtr *out_command)

{
  Command *pCVar1;
  Command *pCVar2;
  bool bVar3;
  Result RVar4;
  Command *local_20;
  
  pCVar2 = local_20;
  RVar4 = Expect(this,"{");
  if (RVar4.enum_ == Error) {
    return (Result)Error;
  }
  RVar4 = ExpectKey(this,"type");
  if (RVar4.enum_ == Error) {
    return (Result)Error;
  }
  bVar3 = Match(this,"\"module\"");
  if (bVar3) {
    wabt::MakeUnique<spectest::ModuleCommand>();
    RVar4 = Expect(this,",");
    if ((((RVar4.enum_ != Error) && (RVar4 = ParseLine(this,&local_20->line), RVar4.enum_ != Error))
        && (RVar4 = Expect(this,","), RVar4.enum_ != Error)) &&
       (RVar4 = ParseOptNameStringValue(this,(string *)&local_20[3].type), RVar4.enum_ != Error)) {
      RVar4 = ParseFilename(this,(string *)&local_20[1].type);
      goto LAB_0018811e;
    }
LAB_0018840c:
    bVar3 = false;
  }
  else {
    bVar3 = Match(this,"\"action\"");
    if (bVar3) {
      wabt::MakeUnique<spectest::ActionCommandBase<(wabt::CommandType)1>>();
      RVar4 = Expect(this,",");
      if (((RVar4.enum_ != Error) && (RVar4 = ParseLine(this,&local_20->line), RVar4.enum_ != Error)
          ) && (RVar4 = Expect(this,","), RVar4.enum_ != Error)) {
        RVar4 = ParseAction(this,(Action *)(local_20 + 1));
LAB_00188053:
        if ((RVar4.enum_ != Error) && (RVar4 = Expect(this,","), RVar4.enum_ != Error)) {
          RVar4 = ParseActionResult(this);
          goto LAB_0018811e;
        }
      }
      goto LAB_0018840c;
    }
    bVar3 = Match(this,"\"register\"");
    if (!bVar3) {
      bVar3 = Match(this,"\"assert_malformed\"");
      if (bVar3) {
        wabt::MakeUnique<spectest::AssertModuleCommand<(wabt::CommandType)3>>();
      }
      else {
        bVar3 = Match(this,"\"assert_invalid\"");
        if (bVar3) {
          wabt::MakeUnique<spectest::AssertModuleCommand<(wabt::CommandType)4>>();
        }
        else {
          bVar3 = Match(this,"\"assert_unlinkable\"");
          if (bVar3) {
            wabt::MakeUnique<spectest::AssertModuleCommand<(wabt::CommandType)5>>();
          }
          else {
            bVar3 = Match(this,"\"assert_uninstantiable\"");
            if (!bVar3) {
              bVar3 = Match(this,"\"assert_return\"");
              if (bVar3) {
                wabt::MakeUnique<spectest::AssertReturnCommand>();
                RVar4 = Expect(this,",");
                if (((RVar4.enum_ != Error) &&
                    (RVar4 = ParseLine(this,&local_20->line), RVar4.enum_ != Error)) &&
                   ((RVar4 = Expect(this,","), RVar4.enum_ != Error &&
                    (((RVar4 = ParseAction(this,(Action *)(local_20 + 1)), RVar4.enum_ != Error &&
                      (RVar4 = Expect(this,","), RVar4.enum_ != Error)) &&
                     (RVar4 = ExpectKey(this,"expected"), RVar4.enum_ != Error)))))) {
                  RVar4 = ParseExpectedValues(this,(
                                                  vector<spectest::ExpectedValue,_std::allocator<spectest::ExpectedValue>_>
                                                  *)&local_20[8].type);
                  goto LAB_0018811e;
                }
              }
              else {
                bVar3 = Match(this,"\"assert_trap\"");
                if (bVar3) {
                  wabt::MakeUnique<spectest::AssertTrapCommandBase<(wabt::CommandType)8>>();
                }
                else {
                  bVar3 = Match(this,"\"assert_exhaustion\"");
                  if (!bVar3) {
                    PrintError(this,"unknown command type");
                    return (Result)Error;
                  }
                  wabt::MakeUnique<spectest::AssertTrapCommandBase<(wabt::CommandType)9>>();
                }
                RVar4 = Expect(this,",");
                if ((((RVar4.enum_ != Error) &&
                     (RVar4 = ParseLine(this,&local_20->line), RVar4.enum_ != Error)) &&
                    (RVar4 = Expect(this,","), RVar4.enum_ != Error)) &&
                   ((RVar4 = ParseAction(this,(Action *)(local_20 + 1)), RVar4.enum_ != Error &&
                    (RVar4 = Expect(this,","), RVar4.enum_ != Error)))) {
                  RVar4 = ParseKeyStringValue(this,"text",(string *)&local_20[8].type);
                  goto LAB_00188053;
                }
              }
              goto LAB_0018840c;
            }
            wabt::MakeUnique<spectest::AssertModuleCommand<(wabt::CommandType)6>>();
          }
        }
      }
      RVar4 = Expect(this,",");
      if ((((RVar4.enum_ != Error) &&
           (RVar4 = ParseLine(this,&local_20->line), RVar4.enum_ != Error)) &&
          ((RVar4 = Expect(this,","), RVar4.enum_ != Error &&
           ((RVar4 = ParseFilename(this,(string *)&local_20[1].type), RVar4.enum_ != Error &&
            (RVar4 = Expect(this,","), RVar4.enum_ != Error)))))) &&
         ((RVar4 = ParseKeyStringValue(this,"text",(string *)&local_20[3].type),
          RVar4.enum_ != Error && (RVar4 = Expect(this,","), RVar4.enum_ != Error)))) {
        RVar4 = ParseModuleType(this,(ModuleType *)(local_20 + 1));
        goto LAB_0018811e;
      }
      goto LAB_0018840c;
    }
    wabt::MakeUnique<spectest::RegisterCommand>();
    RVar4 = Expect(this,",");
    if ((((RVar4.enum_ == Error) || (RVar4 = ParseLine(this,&local_20->line), RVar4.enum_ == Error))
        || (RVar4 = Expect(this,","), RVar4.enum_ == Error)) ||
       (RVar4 = ParseOptNameStringValue(this,(string *)(local_20 + 3)), RVar4.enum_ == Error))
    goto LAB_0018840c;
    RVar4 = ParseKeyStringValue(this,"as",(string *)(local_20 + 1));
LAB_0018811e:
    if (RVar4.enum_ == Error) goto LAB_0018840c;
    local_20 = (Command *)0x0;
    pCVar1 = (out_command->_M_t).
             super___uniq_ptr_impl<spectest::Command,_std::default_delete<spectest::Command>_>._M_t.
             super__Tuple_impl<0UL,_spectest::Command_*,_std::default_delete<spectest::Command>_>.
             super__Head_base<0UL,_spectest::Command_*,_false>._M_head_impl;
    (out_command->_M_t).
    super___uniq_ptr_impl<spectest::Command,_std::default_delete<spectest::Command>_>._M_t.
    super__Tuple_impl<0UL,_spectest::Command_*,_std::default_delete<spectest::Command>_>.
    super__Head_base<0UL,_spectest::Command_*,_false>._M_head_impl = pCVar2;
    if (pCVar1 == (Command *)0x0) goto LAB_00188424;
    (*pCVar1->_vptr_Command[1])();
    bVar3 = true;
  }
  if (local_20 != (Command *)0x0) {
    (*local_20->_vptr_Command[1])();
  }
  if (!bVar3) {
    return (Result)Error;
  }
LAB_00188424:
  RVar4 = Expect(this,"}");
  return (Result)(uint)(RVar4.enum_ == Error);
}

Assistant:

wabt::Result JSONParser::ParseCommand(CommandPtr* out_command) {
  EXPECT("{");
  EXPECT_KEY("type");
  if (Match("\"module\"")) {
    auto command = MakeUnique<ModuleCommand>();
    EXPECT(",");
    CHECK_RESULT(ParseLine(&command->line));
    EXPECT(",");
    CHECK_RESULT(ParseOptNameStringValue(&command->name));
    CHECK_RESULT(ParseFilename(&command->filename));
    *out_command = std::move(command);
  } else if (Match("\"action\"")) {
    auto command = MakeUnique<ActionCommand>();
    EXPECT(",");
    CHECK_RESULT(ParseLine(&command->line));
    EXPECT(",");
    CHECK_RESULT(ParseAction(&command->action));
    EXPECT(",");
    CHECK_RESULT(ParseActionResult());
    *out_command = std::move(command);
  } else if (Match("\"register\"")) {
    auto command = MakeUnique<RegisterCommand>();
    EXPECT(",");
    CHECK_RESULT(ParseLine(&command->line));
    EXPECT(",");
    CHECK_RESULT(ParseOptNameStringValue(&command->name));
    PARSE_KEY_STRING_VALUE("as", &command->as);
    *out_command = std::move(command);
  } else if (Match("\"assert_malformed\"")) {
    auto command = MakeUnique<AssertMalformedCommand>();
    EXPECT(",");
    CHECK_RESULT(ParseLine(&command->line));
    EXPECT(",");
    CHECK_RESULT(ParseFilename(&command->filename));
    EXPECT(",");
    PARSE_KEY_STRING_VALUE("text", &command->text);
    EXPECT(",");
    CHECK_RESULT(ParseModuleType(&command->type));
    *out_command = std::move(command);
  } else if (Match("\"assert_invalid\"")) {
    auto command = MakeUnique<AssertInvalidCommand>();
    EXPECT(",");
    CHECK_RESULT(ParseLine(&command->line));
    EXPECT(",");
    CHECK_RESULT(ParseFilename(&command->filename));
    EXPECT(",");
    PARSE_KEY_STRING_VALUE("text", &command->text);
    EXPECT(",");
    CHECK_RESULT(ParseModuleType(&command->type));
    *out_command = std::move(command);
  } else if (Match("\"assert_unlinkable\"")) {
    auto command = MakeUnique<AssertUnlinkableCommand>();
    EXPECT(",");
    CHECK_RESULT(ParseLine(&command->line));
    EXPECT(",");
    CHECK_RESULT(ParseFilename(&command->filename));
    EXPECT(",");
    PARSE_KEY_STRING_VALUE("text", &command->text);
    EXPECT(",");
    CHECK_RESULT(ParseModuleType(&command->type));
    *out_command = std::move(command);
  } else if (Match("\"assert_uninstantiable\"")) {
    auto command = MakeUnique<AssertUninstantiableCommand>();
    EXPECT(",");
    CHECK_RESULT(ParseLine(&command->line));
    EXPECT(",");
    CHECK_RESULT(ParseFilename(&command->filename));
    EXPECT(",");
    PARSE_KEY_STRING_VALUE("text", &command->text);
    EXPECT(",");
    CHECK_RESULT(ParseModuleType(&command->type));
    *out_command = std::move(command);
  } else if (Match("\"assert_return\"")) {
    auto command = MakeUnique<AssertReturnCommand>();
    EXPECT(",");
    CHECK_RESULT(ParseLine(&command->line));
    EXPECT(",");
    CHECK_RESULT(ParseAction(&command->action));
    EXPECT(",");
    EXPECT_KEY("expected");
    CHECK_RESULT(ParseExpectedValues(&command->expected));
    *out_command = std::move(command);
  } else if (Match("\"assert_trap\"")) {
    auto command = MakeUnique<AssertTrapCommand>();
    EXPECT(",");
    CHECK_RESULT(ParseLine(&command->line));
    EXPECT(",");
    CHECK_RESULT(ParseAction(&command->action));
    EXPECT(",");
    PARSE_KEY_STRING_VALUE("text", &command->text);
    EXPECT(",");
    CHECK_RESULT(ParseActionResult());
    *out_command = std::move(command);
  } else if (Match("\"assert_exhaustion\"")) {
    auto command = MakeUnique<AssertExhaustionCommand>();
    EXPECT(",");
    CHECK_RESULT(ParseLine(&command->line));
    EXPECT(",");
    CHECK_RESULT(ParseAction(&command->action));
    EXPECT(",");
    PARSE_KEY_STRING_VALUE("text", &command->text);
    EXPECT(",");
    CHECK_RESULT(ParseActionResult());
    *out_command = std::move(command);
  } else {
    PrintError("unknown command type");
    return wabt::Result::Error;
  }
  EXPECT("}");
  return wabt::Result::Ok;
}